

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O0

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_getGlobalNode<llvm::Value*>
          (DependenceGraph<dg::LLVMNode> *this,Value *k)

{
  bool bVar1;
  pointer ppVar2;
  long in_RDI;
  iterator it;
  map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [4];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0xd8));
  if (bVar1) {
    std::
    __shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f0f1b);
    local_20[0]._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
         ::find(in_stack_ffffffffffffffc8,(key_type *)0x1f0f28);
    std::
    __shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f0f3e);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_20,&local_28);
    if (bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                          0x1f0f6a);
      return ppVar2->second;
    }
  }
  return (LLVMNode *)0x0;
}

Assistant:

NodeT *_getGlobalNode(T k) {
        if (global_nodes) {
            auto it = global_nodes->find(k);
            if (it != global_nodes->end())
                return it->second;
        }

        return nullptr;
    }